

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O1

unsigned_long __thiscall
libdivide::divider<unsigned_long,_(libdivide::Branching)0>::recover
          (divider<unsigned_long,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  long lVar8;
  uint64_t d_lo;
  uint64_t hi_dividend;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  
  bVar1 = (this->div).denom.more;
  uVar5 = bVar1 & 0x3f;
  uVar2 = (this->div).denom.magic;
  if (uVar2 == 0) {
    uVar6 = 1L << uVar5;
  }
  else {
    uVar11 = 1;
    lVar9 = 1L << uVar5;
    if ((bVar1 & 0x40) == 0) {
      uVar6 = 1;
    }
    else {
      auVar12 = __udivti3(0,lVar9,uVar2,1);
      uVar7 = auVar12._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar2;
      lVar8 = SUB168(auVar3 * auVar4,0);
      uVar10 = ((lVar9 - (auVar12._8_8_ * uVar2 + uVar7 + SUB168(auVar3 * auVar4,8))) -
               (ulong)(lVar8 != 0)) * 2 | (ulong)-lVar8 >> 0x3f;
      if (uVar10 < 2) {
        uVar11 = (ulong)(uVar2 <= (ulong)(lVar8 * -2) && uVar10 == 1);
      }
      uVar6 = uVar11 + 1 + uVar7 * 2;
    }
  }
  return uVar6;
}

Assistant:

T recover() const { return div.recover(); }